

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

void prvTidyFixAnchors(TidyDocImpl *doc,Node *node,Bool wantName,Bool wantId)

{
  bool bVar1;
  Bool BVar2;
  int iVar3;
  uint uVar4;
  Stack *stack_00;
  AttVal *av;
  AttVal *attr;
  bool bVar5;
  Node *local_68;
  bool local_5a;
  bool local_59;
  Bool IdHasValue;
  Bool NameHasValue;
  Bool NameEmitted;
  Bool IdEmitted;
  Bool hadId;
  Bool hadName;
  AttVal *id;
  AttVal *name;
  Node *next;
  Stack *stack;
  Bool wantId_local;
  Bool wantName_local;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  stack_00 = prvTidynewStack(doc,0x10);
  _wantId_local = node;
  while (_wantId_local != (Node *)0x0) {
    local_68 = _wantId_local->next;
    BVar2 = prvTidyIsAnchorElement(doc,_wantId_local);
    if (BVar2 != no) {
      av = prvTidyAttrGetById(_wantId_local,TidyAttr_NAME);
      attr = prvTidyAttrGetById(_wantId_local,TidyAttr_ID);
      bVar1 = false;
      bVar5 = false;
      if ((av == (AttVal *)0x0) || (attr == (AttVal *)0x0)) {
        if ((av == (AttVal *)0x0) || (wantId == no)) {
          if ((attr != (AttVal *)0x0) && (wantName != no)) {
            uVar4 = prvTidyNodeAttributeVersions(_wantId_local,TidyAttr_NAME);
            bVar5 = (uVar4 & doc->lexer->versionEmitted) != 0;
            if (bVar5) {
              prvTidyRepairAttrValue(doc,_wantId_local,"name",attr->value);
            }
          }
        }
        else {
          uVar4 = prvTidyNodeAttributeVersions(_wantId_local,TidyAttr_ID);
          if ((uVar4 & doc->lexer->versionEmitted) != 0) {
            BVar2 = prvTidyIsValidHTMLID(av->value);
            if (BVar2 == no) {
              prvTidyReportAttrError(doc,_wantId_local,av,0x24d);
            }
            else {
              prvTidyRepairAttrValue(doc,_wantId_local,anon_var_dwarf_417cb + 0x2b,av->value);
            }
            bVar1 = BVar2 != no;
          }
        }
      }
      else {
        local_59 = false;
        if (av != (AttVal *)0x0) {
          local_59 = av->value != (tmbstr)0x0;
        }
        local_5a = false;
        if (attr != (AttVal *)0x0) {
          local_5a = attr->value != (tmbstr)0x0;
        }
        if ((local_59 != local_5a) ||
           (((local_59 != false && (local_5a != false)) &&
            (iVar3 = prvTidytmbstrcmp(av->value,attr->value), iVar3 != 0)))) {
          prvTidyReportAttrError(doc,_wantId_local,av,0x242);
        }
      }
      if (((attr != (AttVal *)0x0) && (wantId == no)) &&
         ((av != (AttVal *)0x0 || ((wantName == no || (bVar5)))))) {
        if (wantName == no) {
          prvTidyRemoveAnchorByNode(doc,attr->value,_wantId_local);
        }
        prvTidyRemoveAttribute(doc,_wantId_local,attr);
      }
      if (((av != (AttVal *)0x0) && (wantName == no)) &&
         ((attr != (AttVal *)0x0 || ((wantId == no || (bVar1)))))) {
        if (wantId == no) {
          prvTidyRemoveAnchorByNode(doc,av->value,_wantId_local);
        }
        prvTidyRemoveAttribute(doc,_wantId_local,av);
      }
    }
    if (_wantId_local->content == (Node *)0x0) {
      if (local_68 == (Node *)0x0) {
        local_68 = prvTidypop(stack_00);
      }
      _wantId_local = local_68;
    }
    else {
      prvTidypush(stack_00,local_68);
      _wantId_local = _wantId_local->content;
    }
  }
  prvTidyfreeStack(stack_00);
  return;
}

Assistant:

void TY_(FixAnchors)(TidyDocImpl* doc, Node *node, Bool wantName, Bool wantId)
{
    Stack *stack = TY_(newStack)(doc, 16);
    Node* next;

    while (node)
    {
        next = node->next;

        if (TY_(IsAnchorElement)(doc, node))
        {
            AttVal *name = TY_(AttrGetById)(node, TidyAttr_NAME);
            AttVal *id = TY_(AttrGetById)(node, TidyAttr_ID);
            Bool hadName = name!=NULL;
            Bool hadId = id!=NULL;
            Bool IdEmitted = no;
            Bool NameEmitted = no;

            /* todo: how are empty name/id attributes handled? */

            if (name && id)
            {
                Bool NameHasValue = AttrHasValue(name);
                Bool IdHasValue = AttrHasValue(id);
                if ( (NameHasValue != IdHasValue) ||
                     (NameHasValue && IdHasValue &&
                     TY_(tmbstrcmp)(name->value, id->value) != 0 ) )
                    TY_(ReportAttrError)( doc, node, name, ID_NAME_MISMATCH);
            }
            else if (name && wantId)
            {
                if (TY_(NodeAttributeVersions)( node, TidyAttr_ID )
                    & doc->lexer->versionEmitted)
                {
                    if (TY_(IsValidHTMLID)(name->value))
                    {
                        TY_(RepairAttrValue)(doc, node, "id", name->value);
                        IdEmitted = yes;
                    }
                    else
                        TY_(ReportAttrError)(doc, node, name, INVALID_XML_ID);
                 }
            }
            else if (id && wantName)
            {
                if (TY_(NodeAttributeVersions)( node, TidyAttr_NAME )
                    & doc->lexer->versionEmitted)
                {
                    /* todo: do not assume id is valid */
                    TY_(RepairAttrValue)(doc, node, "name", id->value);
                    NameEmitted = yes;
                }
            }

            if (id && !wantId
                /* make sure that Name has been emitted if requested */
                && (hadName || !wantName || NameEmitted) ) {
                if (!wantId && !wantName)
                    TY_(RemoveAnchorByNode)(doc, id->value, node);
                TY_(RemoveAttribute)(doc, node, id);
            }

            if (name && !wantName
                /* make sure that Id has been emitted if requested */
                && (hadId || !wantId || IdEmitted) ) {
                if (!wantId && !wantName)
                    TY_(RemoveAnchorByNode)(doc, name->value, node);
                TY_(RemoveAttribute)(doc, node, name);
            }
        }

        if (node->content)
        {
            TY_(push)(stack, next);
            node = node->content;
            continue;
        }

        node = next ? next : TY_(pop)(stack);
    }
    TY_(freeStack)(stack);
}